

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_serialiserscommon.cpp
# Opt level: O0

void __thiscall
tst_SerialiserCommon::saveLoadByteArray
          (tst_SerialiserCommon *this,AbstractModelSerialiser *serialiser,
          QAbstractItemModel *sourceModel,QAbstractItemModel *destinationModel,bool multiRole,
          bool checkHeaders)

{
  byte bVar1;
  QModelIndex local_88;
  QModelIndex local_70;
  undefined4 local_58;
  undefined1 local_48 [8];
  QByteArray dataArray;
  bool checkHeaders_local;
  bool multiRole_local;
  QAbstractItemModel *destinationModel_local;
  QAbstractItemModel *sourceModel_local;
  AbstractModelSerialiser *serialiser_local;
  tst_SerialiserCommon *this_local;
  
  dataArray.d.size._6_1_ = checkHeaders;
  dataArray.d.size._7_1_ = multiRole;
  AbstractModelSerialiser::setModel((QAbstractItemModel *)serialiser);
  if ((dataArray.d.size._7_1_ & 1) != 0) {
    (**(code **)(*(long *)serialiser + 0x70))(serialiser,0x101);
  }
  QByteArray::QByteArray((QByteArray *)local_48);
  bVar1 = (**(code **)(*(long *)serialiser + 0xa8))(serialiser,local_48);
  bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialiser->saveModel(&dataArray)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                         ,0xe);
  if ((bVar1 & 1) == 0) {
    local_58 = 1;
  }
  else {
    AbstractModelSerialiser::setModel((QAbstractItemModel *)serialiser);
    bVar1 = (**(code **)(*(long *)serialiser + 0xb8))(serialiser,local_48);
    bVar1 = QTest::qVerify((bool)(bVar1 & 1),"serialiser->loadModel(dataArray)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_SerialisersCommon/tst_serialiserscommon.cpp"
                           ,0x10);
    if ((bVar1 & 1) == 0) {
      local_58 = 1;
    }
    else {
      QModelIndex::QModelIndex(&local_70);
      QModelIndex::QModelIndex(&local_88);
      checkModelEqual(this,sourceModel,destinationModel,&local_70,&local_88,
                      (bool)(dataArray.d.size._6_1_ & 1));
      local_58 = 0;
    }
  }
  QByteArray::~QByteArray((QByteArray *)local_48);
  return;
}

Assistant:

void tst_SerialiserCommon::saveLoadByteArray(AbstractModelSerialiser *serialiser, const QAbstractItemModel *sourceModel,
                                             QAbstractItemModel *destinationModel, bool multiRole, bool checkHeaders) const
{
    serialiser->setModel(sourceModel);
    if (multiRole)
        serialiser->addRoleToSave(Qt::UserRole + 1);
    QByteArray dataArray;
    QVERIFY(serialiser->saveModel(&dataArray));
    serialiser->setModel(destinationModel);
    QVERIFY(serialiser->loadModel(dataArray));
    checkModelEqual(sourceModel, destinationModel, QModelIndex(), QModelIndex(), checkHeaders);
}